

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# range.cpp
# Opt level: O1

ScalarFunctionSet * duckdb::GenerateSeriesFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  pointer pSVar1;
  LogicalType varargs;
  LogicalType varargs_00;
  LogicalType varargs_01;
  LogicalType varargs_02;
  ScalarFunctionSet *in_RDI;
  long lVar2;
  ScalarFunction *func;
  pointer function;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  initializer_list<duckdb::LogicalType> __l_01;
  initializer_list<duckdb::LogicalType> __l_02;
  undefined4 in_stack_fffffffffffff854;
  undefined4 in_stack_fffffffffffff85c;
  FunctionNullHandling in_stack_fffffffffffff868;
  bind_lambda_function_t in_stack_fffffffffffff870;
  LogicalType local_788;
  ScalarFunctionSet *local_770;
  scalar_function_t local_768;
  scalar_function_t local_748;
  scalar_function_t local_728;
  scalar_function_t local_708;
  LogicalType local_6e8 [4];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_688;
  LogicalType local_670;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_658;
  LogicalType local_640;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_628;
  LogicalType local_610;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_5f8;
  LogicalType local_5e0;
  LogicalType local_5c8;
  LogicalType local_5b0;
  LogicalType local_598;
  ScalarFunction local_580;
  ScalarFunction local_458;
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0;
  
  ScalarFunctionSet::ScalarFunctionSet(in_RDI);
  local_770 = in_RDI;
  LogicalType::LogicalType(local_6e8,BIGINT);
  __l._M_len = 1;
  __l._M_array = local_6e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_5f8,__l,(allocator_type *)&stack0xfffffffffffff877);
  LogicalType::LogicalType(&local_788,BIGINT);
  LogicalType::LIST(&local_610,&local_788);
  local_708.super__Function_base._M_functor._8_8_ = 0;
  local_708.super__Function_base._M_functor._M_unused._M_object =
       ListRangeFunction<duckdb::NumericRangeInfo,true>;
  local_708._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_708.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_598,INVALID);
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._0_4_ = 0;
  varargs._0_8_ = &local_598;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr._4_4_ = in_stack_fffffffffffff854;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._0_4_ = 0;
  varargs.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi._4_4_ = in_stack_fffffffffffff85c;
  ScalarFunction::ScalarFunction
            (&local_208,(vector<duckdb::LogicalType,_true> *)&local_5f8,&local_610,&local_708,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs,CONSISTENT,
             in_stack_fffffffffffff868,in_stack_fffffffffffff870);
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_208);
  local_208.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0247c280;
  if (local_208.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_208.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_208.function.super__Function_base._M_manager)
              ((_Any_data *)&local_208.function,(_Any_data *)&local_208.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_598);
  if (local_708.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_708.super__Function_base._M_manager)
              ((_Any_data *)&local_708,(_Any_data *)&local_708,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_610);
  LogicalType::~LogicalType(&local_788);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_5f8);
  LogicalType::~LogicalType(local_6e8);
  LogicalType::LogicalType(local_6e8,BIGINT);
  LogicalType::LogicalType(local_6e8 + 1,BIGINT);
  __l_00._M_len = 2;
  __l_00._M_array = local_6e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_628,__l_00,(allocator_type *)&stack0xfffffffffffff877);
  LogicalType::LogicalType(&local_788,BIGINT);
  LogicalType::LIST(&local_640,&local_788);
  local_728.super__Function_base._M_functor._8_8_ = 0;
  local_728.super__Function_base._M_functor._M_unused._M_object =
       ListRangeFunction<duckdb::NumericRangeInfo,true>;
  local_728._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_728.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5b0,INVALID);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_00._0_8_ = &local_5b0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff854;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff85c;
  ScalarFunction::ScalarFunction
            (&local_330,(vector<duckdb::LogicalType,_true> *)&local_628,&local_640,&local_728,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_00,CONSISTENT,
             in_stack_fffffffffffff868,in_stack_fffffffffffff870);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_330);
  local_330.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0247c280;
  if (local_330.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_330.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_330.function.super__Function_base._M_manager)
              ((_Any_data *)&local_330.function,(_Any_data *)&local_330.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_5b0);
  if (local_728.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_728.super__Function_base._M_manager)
              ((_Any_data *)&local_728,(_Any_data *)&local_728,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_640);
  LogicalType::~LogicalType(&local_788);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_628);
  lVar2 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_6e8[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_6e8,BIGINT);
  LogicalType::LogicalType(local_6e8 + 1,BIGINT);
  LogicalType::LogicalType(local_6e8 + 2,BIGINT);
  __l_01._M_len = 3;
  __l_01._M_array = local_6e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_658,__l_01,(allocator_type *)&stack0xfffffffffffff877);
  LogicalType::LogicalType(&local_788,BIGINT);
  LogicalType::LIST(&local_670,&local_788);
  local_748.super__Function_base._M_functor._8_8_ = 0;
  local_748.super__Function_base._M_functor._M_unused._M_object =
       ListRangeFunction<duckdb::NumericRangeInfo,true>;
  local_748._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_748.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5c8,INVALID);
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_01._0_8_ = &local_5c8;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff854;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_01.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff85c;
  ScalarFunction::ScalarFunction
            (&local_458,(vector<duckdb::LogicalType,_true> *)&local_658,&local_670,&local_748,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_01,CONSISTENT,
             in_stack_fffffffffffff868,in_stack_fffffffffffff870);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_458);
  local_458.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0247c280;
  if (local_458.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_458.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_458.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_458.function.super__Function_base._M_manager)
              ((_Any_data *)&local_458.function,(_Any_data *)&local_458.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_458.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_5c8);
  if (local_748.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_748.super__Function_base._M_manager)
              ((_Any_data *)&local_748,(_Any_data *)&local_748,__destroy_functor);
  }
  LogicalType::~LogicalType(&local_670);
  LogicalType::~LogicalType(&local_788);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_658);
  lVar2 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_6e8[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  LogicalType::LogicalType(local_6e8,TIMESTAMP);
  LogicalType::LogicalType(local_6e8 + 1,TIMESTAMP);
  LogicalType::LogicalType(local_6e8 + 2,INTERVAL);
  __l_02._M_len = 3;
  __l_02._M_array = local_6e8;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_688,__l_02,(allocator_type *)&stack0xfffffffffffff877);
  LogicalType::LogicalType(&local_788,TIMESTAMP);
  LogicalType::LIST(local_6e8 + 3,&local_788);
  local_768.super__Function_base._M_functor._8_8_ = 0;
  local_768.super__Function_base._M_functor._M_unused._M_object =
       ListRangeFunction<duckdb::TimestampRangeInfo,true>;
  local_768._M_invoker =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_invoke;
  local_768.super__Function_base._M_manager =
       ::std::
       _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
       ::_M_manager;
  LogicalType::LogicalType(&local_5e0,INVALID);
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
  varargs_02._0_8_ = &local_5e0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
       in_stack_fffffffffffff854;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_ = 0;
  varargs_02.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       in_stack_fffffffffffff85c;
  ScalarFunction::ScalarFunction
            (&local_580,(vector<duckdb::LogicalType,_true> *)&local_688,local_6e8 + 3,&local_768,
             (bind_scalar_function_t)0x0,(bind_scalar_function_extended_t)0x0,
             (function_statistics_t)0x0,(init_local_state_t)0x0,varargs_02,CONSISTENT,
             in_stack_fffffffffffff868,in_stack_fffffffffffff870);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_580);
  local_580.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_0247c280;
  if (local_580.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_580.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_580.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_580.function.super__Function_base._M_manager)
              ((_Any_data *)&local_580.function,(_Any_data *)&local_580.function,__destroy_functor);
  }
  BaseScalarFunction::~BaseScalarFunction(&local_580.super_BaseScalarFunction);
  LogicalType::~LogicalType(&local_5e0);
  if (local_768.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_768.super__Function_base._M_manager)
              ((_Any_data *)&local_768,(_Any_data *)&local_768,__destroy_functor);
  }
  LogicalType::~LogicalType(local_6e8 + 3);
  LogicalType::~LogicalType(&local_788);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_688);
  lVar2 = 0x30;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_6e8[0].id_ + lVar2));
    lVar2 = lVar2 + -0x18;
  } while (lVar2 != -0x18);
  function = (local_770->super_FunctionSet<duckdb::ScalarFunction>).functions.
             super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
             _M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (local_770->super_FunctionSet<duckdb::ScalarFunction>).functions.
           super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           super__Vector_base<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (function != pSVar1) {
    do {
      BaseScalarFunction::SetReturnsError(&local_e0,&function->super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      function = function + 1;
    } while (function != pSVar1);
  }
  return local_770;
}

Assistant:

ScalarFunctionSet GenerateSeriesFun::GetFunctions() {
	ScalarFunctionSet generate_series;
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT}, LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT},
	                                           LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::BIGINT, LogicalType::BIGINT, LogicalType::BIGINT},
	                                           LogicalType::LIST(LogicalType::BIGINT),
	                                           ListRangeFunction<NumericRangeInfo, true>));
	generate_series.AddFunction(ScalarFunction({LogicalType::TIMESTAMP, LogicalType::TIMESTAMP, LogicalType::INTERVAL},
	                                           LogicalType::LIST(LogicalType::TIMESTAMP),
	                                           ListRangeFunction<TimestampRangeInfo, true>));
	for (auto &func : generate_series.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return generate_series;
}